

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

void Curl_hsts_cleanup(hsts **hp)

{
  hsts *phVar1;
  Curl_llist_element *pCVar2;
  void *pvVar3;
  
  phVar1 = *hp;
  if (phVar1 != (hsts *)0x0) {
    pCVar2 = (phVar1->list).head;
    while (pCVar2 != (Curl_llist_element *)0x0) {
      pvVar3 = pCVar2->ptr;
      pCVar2 = pCVar2->next;
      (*Curl_cfree)(*(void **)((long)pvVar3 + 0x18));
      (*Curl_cfree)(pvVar3);
    }
    (*Curl_cfree)(phVar1->filename);
    (*Curl_cfree)(phVar1);
    *hp = (hsts *)0x0;
  }
  return;
}

Assistant:

void Curl_hsts_cleanup(struct hsts **hp)
{
  struct hsts *h = *hp;
  if(h) {
    struct Curl_llist_element *e;
    struct Curl_llist_element *n;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      hsts_free(sts);
    }
    free(h->filename);
    free(h);
    *hp = NULL;
  }
}